

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O1

void __thiscall mdsplit::mdsplitter::generate_navigation_files(mdsplitter *this)

{
  size_type sVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  _List _Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  istream *piVar11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  ostream *poVar13;
  _Base_ptr p_Var14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  path *__p;
  pointer pmVar18;
  mdsection *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  long lVar19;
  _Base_ptr p_Var20;
  string current_line;
  string sidebar_name;
  anon_class_8_1_834c233f add_content;
  path previous_path;
  map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  navigations;
  path f;
  path p;
  string local_550;
  ulong *local_530;
  long local_528;
  ulong local_520 [2];
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  ulong local_4f0;
  mdsplitter *local_4e8;
  path local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  anon_class_8_1_834c233f local_498;
  undefined1 local_490 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_470;
  _Rb_tree<std::filesystem::__cxx11::path,_std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_468;
  undefined1 local_438 [8];
  size_type local_430;
  ios_base local_340 [264];
  path local_238 [13];
  
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498.navigations =
       (map<std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        *)&local_468;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  std::filesystem::__cxx11::path::path((path *)local_490,&this->output_dir_);
  pmVar18 = (this->sections_).
            super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pmVar18) {
    uVar17 = 0;
    local_4e8 = this;
    do {
      this_00 = pmVar18 + uVar17;
      local_4f0 = uVar17;
      bVar6 = mdsection::has_content(this_00,false,false);
      if (bVar6) {
        __p = &this_00->filepath;
        std::filesystem::__cxx11::path::parent_path();
        sVar1 = (this_00->filepath)._M_pathname._M_string_length;
        if (sVar1 == 0) {
LAB_001283af:
          std::filesystem::__cxx11::path::path((path *)local_438);
        }
        else {
          _Var2._M_head_impl =
               (this_00->filepath)._M_cmpts._M_impl._M_t.
               super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               ._M_t.
               super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
               _M_head_impl;
          if ((~(byte)_Var2._M_head_impl & 3) != 0) {
            if ((((ulong)_Var2._M_head_impl & 3) == 0) &&
               ((__p->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
              if (((ulong)_Var2._M_head_impl & 3) == 0) {
                lVar19 = std::filesystem::__cxx11::path::_List::end();
              }
              else {
                lVar19 = 0;
              }
              if ((*(byte *)&(this_00->filepath)._M_cmpts._M_impl._M_t.
                             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             .
                             super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                             ._M_head_impl & 3) == 0) {
                __p = (path *)(lVar19 + -0x30);
              }
              this = local_4e8;
              if ((~*(uint *)&(__p->_M_cmpts)._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl & 3) == 0) goto LAB_0012839d;
            }
            goto LAB_001283af;
          }
LAB_0012839d:
          std::filesystem::__cxx11::path::path((path *)local_438,__p);
        }
        if (((this_00->level == 1) ||
            (pmVar18 = (this->sections_).
                       super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                       _M_impl.super__Vector_impl_data._M_start,
            ((long)(this->sections_).
                   super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pmVar18 >> 7) - 1U <= local_4f0
            )) || (pmVar18[uVar17 + 1].level <= this_00->level)) {
          local_4e0._M_pathname._M_dataplus._M_p = (pointer)&local_4e0._M_pathname.field_2;
          pcVar3 = (this_00->header_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,pcVar3,pcVar3 + (this_00->header_name)._M_string_length);
        }
        else {
          local_4e0._M_pathname._M_dataplus._M_p = (pointer)&local_4e0._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"Introduction","");
        }
        std::operator+(&local_4b8,"  - ",&local_4e0._M_pathname);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_4b8);
        puVar15 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar15) {
          local_500 = *puVar15;
          lStack_4f8 = plVar9[3];
          local_510 = &local_500;
        }
        else {
          local_500 = *puVar15;
          local_510 = (ulong *)*plVar9;
        }
        local_508 = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_530 = local_520;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_530,local_438,(pointer)((long)local_438 + local_430));
        uVar17 = 0xf;
        if (local_510 != &local_500) {
          uVar17 = local_500;
        }
        if (uVar17 < (ulong)(local_528 + local_508)) {
          uVar17 = 0xf;
          if (local_530 != local_520) {
            uVar17 = local_520[0];
          }
          if (uVar17 < (ulong)(local_528 + local_508)) goto LAB_0012851d;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,(ulong)local_510);
        }
        else {
LAB_0012851d:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_530);
        }
        puVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_550.field_2._M_allocated_capacity = *puVar15;
          local_550.field_2._8_8_ = puVar10[3];
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        }
        else {
          local_550.field_2._M_allocated_capacity = *puVar15;
          local_550._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_550._M_string_length = puVar10[1];
        *puVar10 = puVar15;
        puVar10[1] = 0;
        *(undefined1 *)puVar15 = 0;
        generate_navigation_files::anon_class_8_1_834c233f::operator()
                  (&local_498,local_238,&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if (local_530 != local_520) {
          operator_delete(local_530,local_520[0] + 1);
        }
        if (local_510 != &local_500) {
          operator_delete(local_510,local_500 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_pathname._M_dataplus._M_p != &local_4e0._M_pathname.field_2) {
          operator_delete(local_4e0._M_pathname._M_dataplus._M_p,
                          local_4e0._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_438);
        std::filesystem::__cxx11::path::~path(local_238);
      }
      std::filesystem::__cxx11::path::parent_path();
      iVar8 = std::filesystem::__cxx11::path::compare(local_238);
      std::filesystem::__cxx11::path::~path(local_238);
      this = local_4e8;
      uVar17 = local_4f0;
      if (iVar8 != 0) {
        for (; local_4e8 = this, uVar17 != 0; uVar17 = uVar17 - 1) {
          std::filesystem::__cxx11::path::parent_path();
          std::filesystem::__cxx11::path::parent_path();
          iVar8 = std::filesystem::__cxx11::path::compare(local_238);
          std::filesystem::__cxx11::path::~path((path *)local_438);
          std::filesystem::__cxx11::path::~path(local_238);
          this = local_4e8;
          if (iVar8 == 0) goto LAB_00128915;
        }
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::~path((path *)local_438);
        std::operator+(&local_4b8,"  - ",&this_00->header_name);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_4b8);
        puVar15 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar15) {
          local_500 = *puVar15;
          lStack_4f8 = plVar9[3];
          local_510 = &local_500;
        }
        else {
          local_500 = *puVar15;
          local_510 = (ulong *)*plVar9;
        }
        local_508 = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::relative((path *)local_438,&local_4e0);
        local_530 = local_520;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_530,local_438,(pointer)((long)local_438 + local_430));
        uVar17 = 0xf;
        if (local_510 != &local_500) {
          uVar17 = local_500;
        }
        if (uVar17 < (ulong)(local_528 + local_508)) {
          uVar17 = 0xf;
          if (local_530 != local_520) {
            uVar17 = local_520[0];
          }
          if (uVar17 < (ulong)(local_528 + local_508)) goto LAB_00128808;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_530,0,(char *)0x0,(ulong)local_510);
        }
        else {
LAB_00128808:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_530);
        }
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        puVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_550.field_2._M_allocated_capacity = *puVar15;
          local_550.field_2._8_8_ = puVar10[3];
        }
        else {
          local_550.field_2._M_allocated_capacity = *puVar15;
          local_550._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_550._M_string_length = puVar10[1];
        *puVar10 = puVar15;
        puVar10[1] = 0;
        *(undefined1 *)puVar15 = 0;
        generate_navigation_files::anon_class_8_1_834c233f::operator()
                  (&local_498,local_238,&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if (local_530 != local_520) {
          operator_delete(local_530,local_520[0] + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_438);
        std::filesystem::__cxx11::path::~path(&local_4e0);
        if (local_510 != &local_500) {
          operator_delete(local_510,local_500 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path(local_238);
      }
LAB_00128915:
      std::filesystem::__cxx11::path::parent_path();
      std::__cxx11::string::operator=((string *)local_490,(string *)local_238);
      _Var5._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           local_238[0]._M_cmpts._M_impl._M_t.
           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
           _M_head_impl;
      _Var2._M_head_impl = local_470._M_head_impl;
      uVar17 = local_4f0;
      local_238[0]._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
              )0x0;
      local_470._M_head_impl =
           (_Impl *)_Var5._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl;
      if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
           )_Var2._M_head_impl !=
          (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           )0x0) {
        std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                  ((_Impl_deleter *)&local_470,_Var2._M_head_impl);
      }
      std::filesystem::__cxx11::path::clear(local_238);
      std::filesystem::__cxx11::path::~path(local_238);
      uVar17 = uVar17 + 1;
      pmVar18 = (this->sections_).
                super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(this->sections_).
                                    super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar18 >> 7)
            );
  }
  if ((_Rb_tree_header *)local_468._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_468._M_impl.super__Rb_tree_header) {
    local_4e8 = _VTT;
    local_4f0 = _remove;
    p_Var14 = local_468._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::filesystem::__cxx11::path::path(&local_4e0,(path *)(p_Var14 + 1));
      std::filesystem::__cxx11::path::_M_append(&local_4e0,6,".pages");
      std::ifstream::ifstream(local_238,local_4e0._M_pathname._M_dataplus._M_p,_S_in);
      local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
      local_550._M_string_length = 0;
      local_550.field_2._M_allocated_capacity =
           local_550.field_2._M_allocated_capacity & 0xffffffffffffff00;
      lVar19 = 8;
      uVar17 = 0;
      do {
        while( true ) {
          cVar7 = std::ios::widen((char)*(undefined8 *)
                                         (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                  (char)local_238);
          piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_238,(string *)&local_550,cVar7);
          if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) {
            bVar6 = false;
            goto LAB_00128acd;
          }
          p_Var20 = p_Var14[2]._M_parent;
          if ((ulong)((long)p_Var14[2]._M_left - (long)p_Var20 >> 5) <= uVar17) break;
          bVar6 = true;
          if (((_Base_ptr)local_550._M_string_length != p_Var20[uVar17]._M_parent) ||
             (((_Base_ptr)local_550._M_string_length != (_Base_ptr)0x0 &&
              (iVar8 = bcmp(local_550._M_dataplus._M_p,*(void **)(p_Var20 + uVar17),
                            local_550._M_string_length), iVar8 != 0)))) goto LAB_00128acd;
          uVar17 = uVar17 + 1;
          lVar19 = lVar19 + 0x20;
        }
      } while ((_Base_ptr)local_550._M_string_length == (_Base_ptr)0x0);
      bVar6 = true;
LAB_00128acd:
      uVar16 = (long)p_Var14[2]._M_left - (long)p_Var14[2]._M_parent >> 5;
      if (uVar17 < uVar16) {
        plVar9 = (long *)((long)&(p_Var14[2]._M_parent)->_M_color + lVar19);
        do {
          if (*plVar9 != 0) {
            bVar6 = true;
          }
          uVar16 = uVar16 - 1;
          plVar9 = plVar9 + 4;
        } while (uVar17 != uVar16);
      }
      if (bVar6) {
        std::ofstream::ofstream(local_438,local_4e0._M_pathname._M_dataplus._M_p,_S_out);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Saving ",7);
        pbVar12 = std::filesystem::__cxx11::operator<<
                            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4e0);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar12 + -0x18) + (char)pbVar12);
        std::ostream::put((char)pbVar12);
        std::ostream::flush();
        p_Var4 = p_Var14[2]._M_left;
        for (p_Var20 = p_Var14[2]._M_parent; p_Var20 != p_Var4; p_Var20 = p_Var20 + 1) {
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,*(char **)p_Var20,(long)p_Var20->_M_parent);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        local_438 = (undefined1  [8])local_4e8;
        *(ulong *)(local_438 +
                  (long)local_4e8[-1].sections_.
                        super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                        _M_impl.super__Vector_impl_data._M_start) = local_4f0;
        std::filebuf::~filebuf((filebuf *)&local_430);
        std::ios_base::~ios_base(local_340);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File ",5);
        pbVar12 = std::filesystem::__cxx11::operator<<
                            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pbVar12," has not changed ",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar12 + -0x18) + (char)pbVar12);
        std::ostream::put((char)pbVar12);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_238);
      std::filesystem::__cxx11::path::~path(&local_4e0);
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != &local_468._M_impl.super__Rb_tree_header);
  }
  std::filesystem::__cxx11::path::~path((path *)local_490);
  std::
  _Rb_tree<std::filesystem::__cxx11::path,_std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_468);
  return;
}

Assistant:

void mdsplitter::generate_navigation_files() {
        // path -> navigation items in the path
        using navigation_content = std::vector<std::string>;
        std::map<fs::path, navigation_content> navigations;

        // function to add content to these files
        auto add_content = [&](const fs::path &p, const std::string &line) {
            auto it = navigations.find(p);
            if (it == navigations.end()) {
                navigations[p] = {"nav:", line};
            } else {
                navigations[p].emplace_back(line);
            }
        };

        // Add sections in all relevant navigation files
        fs::path previous_path = output_dir_;
        for (size_t i = 0; i < sections_.size(); ++i) {
            // Add file to its own navigation pages (if there's content)
            auto &section = sections_[i];
            if (section.has_content()) {
                fs::path p = section.filepath.parent_path();
                fs::path f = section.filepath.filename();
                bool has_children = section.level != 1 &&
                                    i < sections_.size() - 1 &&
                                    sections_[i + 1].level > section.level;
                std::string sidebar_name =
                    has_children ? "Introduction" : section.header_name;
                add_content(p, "  - " + sidebar_name + ": " + f.string());
            }

            // Add file to the parent navigation pages (if it's first in this
            // directory)
            bool is_a_new_directory =
                section.filepath.parent_path() != previous_path;
            if (is_a_new_directory) {
                // check if this is the first file in this dir
                bool is_first = true;
                for (size_t j = 0; j < i; ++j) {
                    if (sections_[j].filepath.parent_path() ==
                        section.filepath.parent_path()) {
                        is_first = false;
                        break;
                    }
                }

                // if it's first file in this dir
                if (is_first) {
                    // put it in the parent path navigation list too
                    fs::path grand_path =
                        section.filepath.parent_path().parent_path();
                    add_content(grand_path,
                                "  - " + section.header_name + ": " +
                                    fs::relative(section.filepath.parent_path(),
                                                 grand_path)
                                        .string());
                }
            }
            previous_path = section.filepath.parent_path();
        }

        // Save the .pages
        for (const auto &[p, content] : navigations) {
            fs::path pages_file = p;
            pages_file /= ".pages";

            // Check if file has changed
            std::ifstream fin(pages_file);
            bool has_changed = false;
            std::string current_line;
            size_t content_idx = 0;
            while (std::getline(fin, current_line)) {
                if (content_idx < content.size()) {
                    if (current_line != content[content_idx]) {
                        has_changed = true;
                        break;
                    }
                    ++content_idx;
                } else {
                    if (!current_line.empty()) {
                        has_changed = true;
                        break;
                    }
                }
            }
            if (content_idx < content.size()) {
                for (size_t i = content_idx; i < content.size(); ++i) {
                    if (!content[i].empty()) {
                        has_changed = true;
                    }
                }
            }

            if (!has_changed) {
                std::cout << "File " << pages_file << " has not changed "
                          << std::endl;
            }

            // Save file if its contents have changed
            if (has_changed) {
                std::ofstream fout(pages_file);
                std::cout << "Saving " << pages_file << std::endl;
                for (const auto &line : content) {
                    fout << line << std::endl;
                }
            }
        }
    }